

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

bool CSOAA::test_ldf_sequence(ldf *data,multi_ex *ec_seq)

{
  vw_ostream *pvVar1;
  vw *pvVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  example **ec;
  pointer ppeVar6;
  pointer ppeVar7;
  
  ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar7 == ppeVar6) {
    bVar4 = 1;
  }
  else {
    bVar4 = (*(code *)PTR_test_label_002f0288)(&(*ppeVar6)->l);
    ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  for (; ppeVar6 != ppeVar7; ppeVar6 = ppeVar6 + 1) {
    bVar5 = (*(code *)PTR_test_label_002f0288)(&(*ppeVar6)->l);
    if (bVar5 != (bVar4 & 1)) {
      pvVar2 = data->all;
      pvVar1 = &pvVar2->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,
                 "warning: ldf example has mix of train/test data; assuming test",0x3e);
      cVar3 = (char)pvVar1;
      std::ios::widen((char)(pvVar2->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      bVar4 = 1;
    }
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool test_ldf_sequence(ldf& data, multi_ex& ec_seq)
{
  bool isTest;
  if (0 == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[0]->l);
  for (const auto & ec : ec_seq)
  {
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
  }
  return isTest;
}